

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gc_heap.c
# Opt level: O1

sexp sexp_adjust_fields(sexp dstp,sexp_conflict *types,_func_sexp_void_ptr_sexp *adjust_fn,
                       void *adata)

{
  short sVar1;
  uint uVar2;
  sexp_conflict psVar3;
  sexp psVar4;
  size_t sVar5;
  ulong uVar6;
  ulong uVar7;
  
  uVar2 = dstp->tag;
  psVar3 = types[uVar2];
  uVar6 = (long)(psVar3->value).type.field_len_base +
          (ulong)(psVar3->value).type.field_len_scale *
          *(long *)((long)&dstp->tag + (long)(psVar3->value).type.field_len_off);
  if (uVar6 != 0) {
    sVar1 = (psVar3->value).type.field_base;
    uVar7 = 0;
    do {
      psVar4 = *(sexp *)((long)&dstp->tag + uVar7 * 8 + (long)sVar1);
      if (psVar4 == (sexp)0x0) {
        psVar4 = (sexp)0x0;
      }
      else if ((((ulong)psVar4 & 3) == 0) &&
              (psVar4 = (*adjust_fn)(adata,psVar4), ((ulong)psVar4 & 3) != 0)) {
        sVar5 = strlen(gc_heap_err_str);
        snprintf(gc_heap_err_str + sVar5,0x100 - sVar5," from adjust fields, tag=%u i=%d",
                 (ulong)uVar2,uVar7 & 0xffffffff);
        return (sexp)&DAT_0000003e;
      }
      *(sexp *)((long)&dstp->tag + uVar7 * 8 + (long)sVar1) = psVar4;
      uVar7 = uVar7 + 1;
    } while (uVar6 != uVar7);
  }
  return (sexp)&DAT_0000013e;
}

Assistant:

static sexp sexp_adjust_fields(sexp dstp, sexp* types, sexp (* adjust_fn)(void *, sexp), void *adata) {
  sexp_tag_t tag           = sexp_pointer_tag(dstp);
  sexp       type_spec     = types[tag];
  size_t     type_sexp_cnt = sexp_type_num_slots_of_object(type_spec, dstp);
  sexp*      vec           = (sexp*)((unsigned char*)dstp + sexp_type_field_base(type_spec));
  int        i;
  
  for (i = 0; i < type_sexp_cnt; i++) {
    sexp src = vec[i];
    sexp dst = src;
    if (src && sexp_pointerp(src)) {
      dst = adjust_fn(adata, src);
      if (!sexp_pointerp(dst)) { 
        size_t sz = strlen(gc_heap_err_str);
        snprintf(gc_heap_err_str + sz, ERR_STR_SIZE - sz, " from adjust fields, tag=%u i=%d", tag, i);
        return SEXP_FALSE; }
    }
    vec[i] = dst;
  }
  return SEXP_TRUE;
}